

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

bool __thiscall Clasp::SolveAlgorithm::reportModel(SolveAlgorithm *this,Solver *s,bool sym)

{
  long *plVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  Model *pMVar5;
  ulong uVar6;
  byte in_DL;
  Solver *in_RSI;
  Solver *in_RDI;
  bool r2;
  bool r1;
  Model *m;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar7;
  byte bVar8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar2 = in_DL & 1;
  pMVar5 = model((SolveAlgorithm *)0x1e3315);
  do {
    bVar8 = 1;
    if ((in_RDI->stats).super_CoreStats.choices != 0) {
      plVar1 = (long *)(in_RDI->stats).super_CoreStats.choices;
      bVar8 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,pMVar5);
    }
    bVar3 = bVar8 & 1;
    uVar7 = true;
    if (((ulong)(in_RDI->stats).multi & 0x100000000) != 0) {
      Solver::sharedContext(in_RSI);
      uVar7 = SharedContext::report
                        ((SharedContext *)
                         CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0
                                                )),in_RDI,
                         (Model *)CONCAT17(bVar8,CONCAT16(uVar7,in_stack_ffffffffffffffc0)));
    }
    if (((((bVar3 & 1) == 0) || ((bool)uVar7 == false)) ||
        (in_stack_ffffffffffffffd6 = uVar7,
        bVar4 = hasLimit((SolveAlgorithm *)in_RSI,(Model *)CONCAT17(bVar2,in_stack_ffffffffffffffe0)
                        ), bVar4)) ||
       (uVar6 = (**(code **)(*(long *)in_RDI + 0x10))(), (uVar6 & 1) != 0)) {
      return false;
    }
    if ((bVar2 & 1) == 0) {
      return true;
    }
    SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1e33dc);
    bVar4 = Enumerator::commitSymmetric
                      ((Enumerator *)in_RDI,
                       (Solver *)CONCAT17(bVar8,CONCAT16(uVar7,in_stack_ffffffffffffffc0)));
  } while (bVar4);
  return true;
}

Assistant:

bool SolveAlgorithm::reportModel(Solver& s, bool sym) const {
	for (const Model& m = model();;) {
		bool r1 = !onModel_ || onModel_->onModel(s, m);
		bool r2 = !reportM_ || s.sharedContext()->report(s, m);
		if (!r1 || !r2 || hasLimit(m) || interrupted()) { return false; }
		if (!sym || !enum_->commitSymmetric(s))         { return true;  }
	}
}